

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

utils * __thiscall
viface::utils::hexdump_abi_cxx11_
          (utils *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  byte bVar1;
  value_type vVar2;
  _Setfill<char> _Var3;
  int iVar4;
  _Setw _Var5;
  int iVar6;
  size_type sVar7;
  undefined8 uVar8;
  ostream *poVar9;
  byte *pbVar10;
  const_reference pvVar11;
  int local_19c;
  int iStack_198;
  char c;
  int j;
  int i;
  int buflen;
  ostringstream buff;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(bytes);
  iVar4 = (int)sVar7;
  for (iStack_198 = 0; iStack_198 < iVar4; iStack_198 = iStack_198 + 0x10) {
    uVar8 = std::ostream::operator<<((ostream *)&i,std::right);
    _Var3 = std::setfill<char>('0');
    poVar9 = std::operator<<(uVar8,_Var3._M_c);
    _Var5 = std::setw(4);
    poVar9 = std::operator<<(poVar9,_Var5);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iStack_198);
    std::operator<<(poVar9,"  ");
    std::ostream::operator<<((ostream *)&i,std::hex);
    for (local_19c = 0; local_19c < 0x10; local_19c = local_19c + 1) {
      if (iStack_198 + local_19c < iVar4) {
        pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (bytes,(long)(iStack_198 + local_19c));
        bVar1 = *pbVar10;
        _Var3 = std::setfill<char>('0');
        poVar9 = std::operator<<(&i,_Var3._M_c);
        _Var5 = std::setw(2);
        poVar9 = std::operator<<(poVar9,_Var5);
        std::ostream::operator<<(poVar9,(uint)bVar1);
        std::operator<<((ostream *)&i," ");
      }
      else {
        std::operator<<((ostream *)&i,"   ");
      }
    }
    std::ostream::operator<<((ostream *)&i,std::dec);
    std::operator<<((ostream *)&i," ");
    for (local_19c = 0; local_19c < 0x10; local_19c = local_19c + 1) {
      if (iStack_198 + local_19c < iVar4) {
        pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (bytes,(long)(iStack_198 + local_19c));
        vVar2 = *pvVar11;
        iVar6 = isprint((int)(char)vVar2);
        if (iVar6 == 0) {
          std::operator<<((ostream *)&i,".");
        }
        else {
          std::operator<<((ostream *)&i,vVar2);
        }
      }
    }
    std::ostream::operator<<((ostream *)&i,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return this;
}

Assistant:

string hexdump(vector<uint8_t> const& bytes)
{
    ostringstream buff;

    int buflen = bytes.size();

    int i;
    int j;
    char c;

    for (i = 0, j = 0; i < buflen; i += 16) {
        // Print offset
        buff << right << setfill('0') << setw(4) << i << "  ";

        // Print bytes in hexadecimal
        buff << hex;
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                buff << setfill('0') << setw(2) << (int(c) & 0xFF);
                buff << " ";
            } else {
                buff << "   ";
            }
        }
        buff << dec;
        buff << " ";

        // Print printable characters
        for (j = 0; j < 16; j++) {
            if (i + j < buflen) {
                c = bytes[i + j];
                if (isprint(c)) {
                    buff << c;
                } else {
                    buff << ".";
                }
            }
        }
        buff << endl;
    }
    return buff.str();
}